

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlAutomataStatePtr
xmlAutomataNewEpsilon(xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to)

{
  if (from == (xmlAutomataStatePtr)0x0 || am == (xmlAutomataPtr)0x0) {
    to = (xmlAutomataStatePtr)0x0;
  }
  else {
    xmlFAGenerateEpsilonTransition(am,from,to);
    if (to == (xmlAutomataStatePtr)0x0) {
      to = am->state;
    }
  }
  return to;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewEpsilon(xmlAutomataPtr am, xmlAutomataStatePtr from,
		      xmlAutomataStatePtr to) {
    if ((am == NULL) || (from == NULL))
	return(NULL);
    xmlFAGenerateEpsilonTransition(am, from, to);
    if (to == NULL)
	return(am->state);
    return(to);
}